

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O1

void merge_cache_lcp_2way<true,unsigned_char>
               (uchar **from0,lcp_t *lcp_input0,uchar *cache_input0,size_t n0,uchar **from1,
               lcp_t *lcp_input1,uchar *cache_input1,size_t n1,uchar **result,lcp_t *lcp_result,
               uchar *cache_result)

{
  int iVar1;
  uint uVar2;
  lcp_t lVar3;
  byte cache1;
  uchar uVar4;
  uchar **ppuVar5;
  uchar *puVar6;
  uchar **__dest;
  long lVar7;
  lcp_t lVar8;
  ptrdiff_t _Num_1;
  lcp_t *plVar9;
  ptrdiff_t _Num;
  byte local_b9;
  byte *local_b8;
  uchar **local_b0;
  size_t local_a8;
  size_t local_a0;
  lcp_t *local_98;
  lcp_t local_90;
  byte *local_88;
  uchar **local_80;
  lcp_t local_78;
  lcp_t *local_68;
  byte *local_58;
  lcp_t local_40;
  int local_38;
  
  check_input<unsigned_char>(from0,lcp_input0,cache_input0,n0);
  local_a8 = n1;
  check_input<unsigned_char>(from1,lcp_input1,cache_input1,n1);
  local_88 = cache_input0 + 1;
  local_b9 = *cache_input0;
  local_58 = cache_input1 + 1;
  cache1 = *cache_input1;
  if (local_b9 < cache1) {
    puVar6 = *from0;
    if (puVar6 == (uchar *)0x0) {
LAB_001cc32f:
      __assert_fail("a != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x51,"int cmp(const unsigned char *, const unsigned char *)");
    }
    if (*from1 == (uchar *)0x0) {
LAB_001cc34e:
      __assert_fail("b != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x52,"int cmp(const unsigned char *, const unsigned char *)");
    }
    iVar1 = strcmp((char *)puVar6,(char *)*from1);
    if (-1 < iVar1) {
      __assert_fail("cmp(*from0, *from1) < 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x449,
                    "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned char]"
                   );
    }
    *result = puVar6;
    *cache_result = local_b9;
    if (n0 != 1) {
      local_78 = *lcp_input0;
      local_b9 = cache_input0[1];
LAB_001cb86a:
      local_88 = cache_input0 + 2;
      local_98 = lcp_input0 + 1;
      local_b0 = from0 + 1;
      n0 = n0 - 1;
      local_90 = 0;
      goto LAB_001cbbe5;
    }
LAB_001cb9ef:
    __dest = result + 1;
    local_b8 = cache_result + 1;
    local_a0 = 0;
    local_90 = 0;
    local_80 = from1;
    local_68 = lcp_input1;
  }
  else {
    if (local_b9 <= cache1) {
      if (local_b9 != 0) {
        compare((uchar *)&local_40,*from0,(size_t)*from1);
        lVar3 = local_40;
        if (local_38 < 0) {
          *result = *from0;
          *cache_result = local_b9;
          if (*from1 == (uchar *)0x0) {
LAB_001cc4a3:
            __assert_fail("ptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                          ,0x26,"unsigned char get_char(unsigned char *, size_t)");
          }
          lVar8 = *lcp_input0;
          uVar4 = (*from1)[local_40];
          if (n0 == 1) {
            uVar2 = 2;
            goto LAB_001cbbd3;
          }
        }
        else if (local_38 == 0) {
          *result = *from0;
          *cache_result = local_b9;
          lVar8 = *lcp_input0;
          uVar4 = '\0';
          if (n0 == 1) {
            uVar2 = 2;
            goto LAB_001cbbd3;
          }
        }
        else {
          *result = *from1;
          *cache_result = cache1;
          if (*from0 == (uchar *)0x0) goto LAB_001cc4a3;
          lVar3 = *lcp_input1;
          from1 = from1 + 1;
          uVar4 = cache_input1[1];
          lVar8 = local_40;
          if (n1 == 1) {
            uVar2 = 3;
            goto LAB_001cbbd3;
          }
        }
        uVar2 = 0;
LAB_001cbbd3:
        (*(code *)((long)&DAT_001ed4a8 + (long)(int)(&DAT_001ed4a8)[uVar2]))
                  (result + 1,from1,uVar4,&DAT_001ed4a8,lVar3,lVar8);
        return;
      }
      puVar6 = *from0;
      if (puVar6 == (uchar *)0x0) goto LAB_001cc32f;
      if (*from1 == (uchar *)0x0) goto LAB_001cc34e;
      iVar1 = strcmp((char *)puVar6,(char *)*from1);
      if (iVar1 != 0) {
        __assert_fail("cmp(*from0, *from1) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x470,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned char]"
                     );
      }
      *result = puVar6;
      *cache_result = '\0';
      cache1 = 0;
      if (n0 != 1) {
        local_78 = *lcp_input0;
        local_b9 = cache_input0[1];
        goto LAB_001cb86a;
      }
      goto LAB_001cb9ef;
    }
    if (*from0 == (uchar *)0x0) goto LAB_001cc32f;
    puVar6 = *from1;
    if (puVar6 == (uchar *)0x0) goto LAB_001cc34e;
    iVar1 = strcmp((char *)*from0,(char *)puVar6);
    if (iVar1 < 1) {
      __assert_fail("cmp(*from0, *from1) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x45c,
                    "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned char]"
                   );
    }
    *result = puVar6;
    __dest = result + 1;
    *cache_result = cache1;
    local_b8 = cache_result + 1;
    local_78 = 0;
    local_a8 = n1 - 1;
    local_b0 = from0;
    local_98 = lcp_input0;
    if (local_a8 == 0) {
      local_a8 = 0;
      local_a0 = n0;
LAB_001cc1a4:
      if (local_a0 == 0) {
        __assert_fail("n0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x527,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned char]"
                     );
      }
      if (local_a8 != 0) {
        __assert_fail("n1==0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x528,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned char]"
                     );
      }
      *lcp_result = local_78;
      *local_b8 = local_b9;
      memmove(__dest,local_b0,local_a0 * 8);
      memmove(lcp_result + 1,local_98,local_a0 * 8);
      local_a8 = local_a0;
      goto LAB_001cc1f1;
    }
    from1 = from1 + 1;
    local_90 = *lcp_input1;
    lcp_input1 = lcp_input1 + 1;
    cache1 = cache_input1[1];
    local_58 = cache_input1 + 2;
LAB_001cbbe5:
    __dest = result + 1;
    local_b8 = cache_result + 1;
    local_a0 = n0;
LAB_001cbc04:
    do {
      plVar9 = lcp_input1;
      ppuVar5 = from1;
      lVar7 = 0;
      local_80 = ppuVar5;
      local_68 = plVar9;
      while( true ) {
        check_lcp_and_cache<unsigned_char>
                  (__dest[-1],*local_b0,local_78,local_b9,*(uchar **)((long)ppuVar5 + lVar7),
                   local_90,cache1);
        if (local_90 < local_78) break;
        if (local_78 < local_90) {
          if (*local_b0 == (uchar *)0x0) goto LAB_001cc32f;
          puVar6 = *(uchar **)((long)ppuVar5 + lVar7);
          if (puVar6 == (uchar *)0x0) goto LAB_001cc34e;
          iVar1 = strcmp((char *)*local_b0,(char *)puVar6);
          if (iVar1 < 1) {
            __assert_fail("cmp(*from0, *from1) > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                          ,0x4b7,
                          "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned char]"
                         );
          }
        }
        else {
          if (local_b9 < cache1) {
            puVar6 = *local_b0;
            if (puVar6 == (uchar *)0x0) goto LAB_001cc32f;
            if (*(char **)((long)ppuVar5 + lVar7) == (char *)0x0) goto LAB_001cc34e;
            iVar1 = strcmp((char *)puVar6,*(char **)((long)ppuVar5 + lVar7));
            if (-1 < iVar1) {
              __assert_fail("cmp(*from0, *from1) < 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                            ,0x4c6,
                            "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned char]"
                           );
            }
            *__dest = puVar6;
            *lcp_result = local_78;
            *local_b8 = local_b9;
            local_78 = *local_98;
            local_b9 = *local_88;
            goto LAB_001cbeae;
          }
          if (local_b9 <= cache1) {
            local_80 = (uchar **)((long)ppuVar5 + lVar7);
            local_68 = (lcp_t *)((long)plVar9 + lVar7);
            if (local_b9 == 0) {
              puVar6 = *local_b0;
              if (puVar6 == (uchar *)0x0) goto LAB_001cc32f;
              if (*local_80 == (uchar *)0x0) goto LAB_001cc34e;
              iVar1 = strcmp((char *)puVar6,(char *)*local_80);
              if (iVar1 != 0) {
                __assert_fail("cmp(*from0, *from1) == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                              ,0x4e7,
                              "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned char]"
                             );
              }
              local_b0 = local_b0 + 1;
              *__dest = puVar6;
              __dest = __dest + 1;
              *lcp_result = local_78;
              lcp_result = lcp_result + 1;
              *local_b8 = 0;
              local_b8 = local_b8 + 1;
              local_78 = *local_98;
              local_98 = local_98 + 1;
              local_b9 = *local_88;
              local_88 = local_88 + 1;
              local_a0 = local_a0 - 1;
              from1 = local_80;
              lcp_input1 = local_68;
              if (local_a0 != 0) goto LAB_001cbc04;
              local_80 = (uchar **)((long)ppuVar5 + lVar7);
              local_68 = (lcp_t *)((long)plVar9 + lVar7);
              local_a0 = 0;
              goto LAB_001cb9f9;
            }
            compare((uchar *)&local_40,*local_b0,(size_t)*local_80);
            local_90 = local_40;
            if (local_38 < 0) {
              *__dest = *local_b0;
              *lcp_result = local_78;
              *local_b8 = local_b9;
              if (*local_80 == (uchar *)0x0) goto LAB_001cc4a3;
              local_b9 = *local_88;
              local_88 = local_88 + 1;
              local_78 = *local_98;
              local_98 = local_98 + 1;
              local_b0 = local_b0 + 1;
              cache1 = (*local_80)[local_40];
              local_a0 = local_a0 - 1;
              if (local_a0 != 0) goto LAB_001cc13e;
              iVar1 = 2;
              local_a0 = 0;
            }
            else if (local_38 == 0) {
              puVar6 = *local_b0;
              local_b0 = local_b0 + 1;
              *__dest = puVar6;
              *lcp_result = local_78;
              *local_b8 = local_b9;
              local_78 = *local_98;
              local_98 = local_98 + 1;
              local_b9 = *local_88;
              local_88 = local_88 + 1;
              cache1 = 0;
              local_a0 = local_a0 - 1;
              if (local_a0 != 0) goto LAB_001cc13e;
              iVar1 = 2;
              local_a0 = 0;
            }
            else {
              *__dest = *local_80;
              *lcp_result = local_78;
              *local_b8 = local_b9;
              if (*local_b0 == (uchar *)0x0) goto LAB_001cc4a3;
              local_68 = (lcp_t *)((long)plVar9 + lVar7) + 1;
              local_90 = *(lcp_t *)((long)plVar9 + lVar7);
              local_80 = (uchar **)((long)ppuVar5 + lVar7 + 8);
              local_b9 = (*local_b0)[local_40];
              cache1 = *local_58;
              local_58 = local_58 + 1;
              local_a8 = local_a8 - 1;
              local_78 = local_40;
              if (local_a8 == 0) {
                iVar1 = 3;
                local_a8 = 0;
              }
              else {
LAB_001cc13e:
                iVar1 = 0;
              }
            }
            local_b8 = local_b8 + 1;
            __dest = __dest + 1;
            lcp_result = lcp_result + 1;
            from1 = local_80;
            lcp_input1 = local_68;
            if (iVar1 == 0) goto LAB_001cbc04;
            if (iVar1 == 1) {
              return;
            }
            if (iVar1 != 3) goto LAB_001cb9f9;
            goto LAB_001cc1a4;
          }
          if (*local_b0 == (uchar *)0x0) goto LAB_001cc32f;
          puVar6 = *(uchar **)((long)ppuVar5 + lVar7);
          if (puVar6 == (uchar *)0x0) goto LAB_001cc34e;
          iVar1 = strcmp((char *)*local_b0,(char *)puVar6);
          if (iVar1 < 1) {
            __assert_fail("cmp(*from0, *from1) > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                          ,0x4d6,
                          "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned char]"
                         );
          }
        }
        *__dest = puVar6;
        __dest = __dest + 1;
        *lcp_result = local_90;
        lcp_result = lcp_result + 1;
        *local_b8 = cache1;
        local_b8 = local_b8 + 1;
        local_a8 = local_a8 - 1;
        if (local_a8 == 0) {
          local_a8 = 0;
          goto LAB_001cc1a4;
        }
        cache1 = *local_58;
        local_90 = *(ulong *)((long)plVar9 + lVar7);
        local_58 = local_58 + 1;
        local_68 = local_68 + 1;
        local_80 = local_80 + 1;
        lVar7 = lVar7 + 8;
      }
      puVar6 = *local_b0;
      if (puVar6 == (uchar *)0x0) goto LAB_001cc32f;
      if (*(char **)((long)ppuVar5 + lVar7) == (char *)0x0) goto LAB_001cc34e;
      iVar1 = strcmp((char *)puVar6,*(char **)((long)ppuVar5 + lVar7));
      if (-1 < iVar1) {
        __assert_fail("cmp(*from0, *from1) < 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x4ae,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned char]"
                     );
      }
      *__dest = puVar6;
      *lcp_result = local_78;
      *local_b8 = local_b9;
      local_78 = *local_98;
      local_b9 = *local_88;
LAB_001cbeae:
      local_88 = local_88 + 1;
      local_98 = local_98 + 1;
      local_b0 = local_b0 + 1;
      local_b8 = local_b8 + 1;
      __dest = __dest + 1;
      lcp_result = lcp_result + 1;
      local_a0 = local_a0 - 1;
      from1 = (uchar **)((long)ppuVar5 + lVar7);
      lcp_input1 = (lcp_t *)((long)plVar9 + lVar7);
    } while (local_a0 != 0);
    local_a0 = 0;
  }
LAB_001cb9f9:
  if (local_a0 != 0) {
    __assert_fail("n0==0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x51d,
                  "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned char]"
                 );
  }
  if (local_a8 == 0) {
    __assert_fail("n1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x51e,
                  "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned char]"
                 );
  }
  *lcp_result = local_90;
  *local_b8 = cache1;
  memmove(__dest,local_80,local_a8 * 8);
  memmove(lcp_result + 1,local_68,local_a8 * 8);
  local_88 = local_58;
LAB_001cc1f1:
  memmove(local_b8 + 1,local_88,local_a8);
  return;
}

Assistant:

void
merge_cache_lcp_2way(
       unsigned char** from0,  lcp_t* restrict lcp_input0, CharT* restrict cache_input0, size_t n0,
       unsigned char** from1,  lcp_t* restrict lcp_input1, CharT* restrict cache_input1, size_t n1,
       unsigned char** result, lcp_t* restrict lcp_result, CharT* restrict cache_result)
{
	debug() << __func__ << "(): n0=" << n0 << ", n1=" << n1 << '\n';

	check_input(from0, lcp_input0, cache_input0, n0);
	check_input(from1, lcp_input1, cache_input1, n1);

	lcp_t lcp0=0, lcp1=0;
	CharT cache0 = *cache_input0++;
	CharT cache1 = *cache_input1++;
	{
		stat_try_cache();
		if (cache0 < cache1) {
			assert(cmp(*from0, *from1) < 0);
			if (sizeof(CharT) > 1) {
				const int l = lcp(cache0, cache1);
				if (l > 0) {
					cache1 = get_char<CharT>(*from1, l);
				}
				*result++ = *from0++;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				lcp1 = l;
				cache0 = *cache_input0++;
			} else {
				*result++ = *from0++;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				cache0 = *cache_input0++;
			}
			if (--n0 == 0) goto finish0;
		} else if (cache0 > cache1) {
			assert(cmp(*from0, *from1) > 0);
			if (sizeof(CharT) > 1) {
				const int l = lcp(cache0, cache1);
				if (l > 0) {
					cache0 = get_char<CharT>(*from0, l);
				}
				*result++ = *from1++;
				if (OutputLCP) *cache_result++ = cache1;
				lcp0 = l;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
			} else {
				*result++ = *from1++;
				if (OutputLCP) *cache_result++ = cache1;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
			}
			if (--n1 == 0) goto finish1;
		} else {
			if (is_end(cache0)) {
				assert(cmp(*from0, *from1) == 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = l;
					cache0 = *cache_input0++;
					cache1 = 0;
				} else {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					cache0 = *cache_input0++;
					cache1 = 0;
				}
				if (--n0 == 0) goto finish0;
			} else {
				stat_cache_useless();
				int cmp01; lcp_t lcp01;
				std::tie(cmp01, lcp01) = compare(*from0, *from1, sizeof(CharT));
				if (cmp01 < 0) {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = lcp01;
					cache0 = *cache_input0++;
					cache1 = get_char<CharT>(*from1, lcp01);
					if (--n0 == 0) goto finish0;
				} else if (cmp01 == 0) {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = lcp01;
					cache0 = *cache_input0++;
					cache1 = 0;
					if (--n0 == 0) goto finish0;
				} else {
					*result++ = *from1++;
					if (OutputLCP) *cache_result++ = cache1;
					lcp0 = lcp01;
					lcp1 = *lcp_input1++;
					cache0 = get_char<CharT>(*from0, lcp01);
					cache1 = *cache_input1++;
					if (--n1 == 0) goto finish1;
				}
			}
		}
	}
	while (true) {
		debug() << "Starting loop, n0="<<n0<<", n1="<<n1<<" ...\n"
			<< "\tprev   = '"<<*(result-1)<<"'\n"
			<< "\t*from0 = '"<<*from0<<"'\n"
			<< "\t*from1 = '"<<*from1<<"'\n"
			<< "\tlcp0   = " <<lcp0<<"\n"
			<< "\tlcp1   = " <<lcp1<<"\n"
			<< "\tcache0 = '"<<to_str(cache0)<<"'\n"
			<< "\tcache1 = '"<<to_str(cache1)<<"'\n"
			<< "\n";
		check_lcp_and_cache(*(result-1),*from0,lcp0,cache0,*from1,lcp1,cache1);
		if (lcp0 > lcp1) {
			debug() << "\tlcp0 > lcp1\n";
			assert(cmp(*from0, *from1) < 0);
			*result++ = *from0++;
			if (OutputLCP) *lcp_result++ = lcp0;
			if (OutputLCP) *cache_result++ = cache0;
			lcp0 = *lcp_input0++;
			cache0 = *cache_input0++;
			if (--n0 == 0) goto finish0;
		} else if (lcp0 < lcp1) {
			debug() << "\tlcp0 < lcp1\n";
			assert(cmp(*from0, *from1) > 0);
			*result++ = *from1++;
			if (OutputLCP) *lcp_result++ = lcp1;
			if (OutputLCP) *cache_result++ = cache1;
			lcp1 = *lcp_input1++;
			cache1 = *cache_input1++;
			if (--n1 == 0) goto finish1;
		} else {
			debug() << "\tlcp0 == lcp1\n";
			stat_try_cache();
			// Both strings in the sorted sequences have the same
			// prefix than the latest string in output. Check
			// cached characters first.
			if (cache0 < cache1) {
				debug() << "\t\tcache0 < cache1\n";
				assert(cmp(*from0, *from1) < 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					if (l > 0) {
						lcp1 += l;
						cache1 = get_char<CharT>(*from1, lcp1);
					}
				}
				*result++ = *from0++;
				if (OutputLCP) *lcp_result++ = lcp0;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				cache0 = *cache_input0++;
				if (--n0 == 0) goto finish0;
			} else if (cache0 > cache1) {
				debug() << "\t\tcache0 > cache1\n";
				assert(cmp(*from0, *from1) > 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					if (l > 0) {
						lcp0 += l;
						cache0 = get_char<CharT>(*from0, lcp0);
					}
				}
				*result++ = *from1++;
				if (OutputLCP) *lcp_result++ = lcp1;
				if (OutputLCP) *cache_result++ = cache1;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
				if (--n1 == 0) goto finish1;
			} else {
				debug() << "\t\tcache0 == cache1\n";
				if (is_end(cache0)) {
					assert(cmp(*from0, *from1) == 0);
					if (sizeof(CharT) > 1) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 += lcp(cache0, cache1);
						cache0 = *cache_input0++;
						cache1 = 0;
					} else {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						cache0 = *cache_input0++;
					}
					if (--n0 == 0) goto finish0;
				} else {
					stat_cache_useless();
					int cmp01; lcp_t lcp01;
					std::tie(cmp01, lcp01) = compare(*from0, *from1, lcp0+sizeof(CharT));
					if (cmp01 < 0) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 = lcp01;
						cache0 = *cache_input0++;
						cache1 = get_char<CharT>(*from1, lcp01);
						if (--n0 == 0) goto finish0;
					} else if (cmp01 == 0) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 = lcp01;
						cache0 = *cache_input0++;
						cache1 = 0;
						if (--n0 == 0) goto finish0;
					} else {
						*result++ = *from1++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = lcp01;
						lcp1 = *lcp_input1++;
						cache0 = get_char<CharT>(*from0, lcp01);
						cache1 = *cache_input1++;
						if (--n1 == 0) goto finish1;
					}
				}
			}
		}
	}
finish0:
	assert(n0==0);
	assert(n1);
	if (OutputLCP) *lcp_result++ = lcp1;
	if (OutputLCP) *cache_result++ = cache1;
	std::copy(from1, from1+n1, result);
	if (OutputLCP) std::copy(lcp_input1, lcp_input1+n1, lcp_result);
	if (OutputLCP) std::copy(cache_input1, cache_input1+n1, cache_result);
	debug() << '~' << __func__ << '\n';
	return;
finish1:
	assert(n0);
	assert(n1==0);
	if (OutputLCP) *lcp_result++ = lcp0;
	if (OutputLCP) *cache_result++ = cache0;
	std::copy(from0, from0+n0, result);
	if (OutputLCP) std::copy(lcp_input0, lcp_input0+n0, lcp_result);
	if (OutputLCP) std::copy(cache_input0, cache_input0+n0, cache_result);
	debug() << '~' << __func__ << '\n';
	return;
}